

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O2

void GetArms(Col_Word node,Col_Word *leftPtr,Col_Word *rightPtr)

{
  long lVar1;
  uint uVar2;
  size_t sVar3;
  Col_Word CVar4;
  
  if (node != 0) {
    if ((node & 0xf) == 0) {
      if ((*(byte *)node & 2) == 0) goto LAB_0010e6a9;
      uVar2 = *(byte *)node & 0xfffffffe;
    }
    else {
      uVar2 = immediateWordTypes[(uint)node & 0x1f];
    }
    if (uVar2 == 0x1e) {
      lVar1 = *(long *)(node + 8);
      sVar3 = (size_t)*(ushort *)(lVar1 + 2);
      if (sVar3 == 0) {
        sVar3 = Col_ListLength(*(Col_Word *)(lVar1 + 0x10));
      }
      CVar4 = Col_Sublist(*(Col_Word *)(lVar1 + 0x10),*(size_t *)(node + 0x10),sVar3 - 1);
      *leftPtr = CVar4;
      CVar4 = Col_Sublist(*(Col_Word *)(lVar1 + 0x18),0,*(long *)(node + 0x18) - sVar3);
      goto LAB_0010e6b4;
    }
  }
LAB_0010e6a9:
  *leftPtr = *(Col_Word *)(node + 0x10);
  CVar4 = *(Col_Word *)(node + 0x18);
LAB_0010e6b4:
  *rightPtr = CVar4;
  return;
}

Assistant:

static void
GetArms(
    Col_Word rope,          /*!< Rope to extract arms from. Either a subrope or
                                 concat rope. */

    /*! [out] Left arm. */
    Col_Word * leftPtr,

    /*! [out] Right arm. */
    Col_Word * rightPtr)
{
    if (WORD_TYPE(rope) == WORD_TYPE_SUBROPE) {
        /*!
         * @sideeffect
         * If given a subrope of a concat node, create one subrope for each 
         * concat arm.
         */

        Col_Word source = WORD_SUBROPE_SOURCE(rope);
        size_t leftLength;

        ASSERT(WORD_SUBROPE_DEPTH(rope) >= 1);
        ASSERT(WORD_TYPE(source) == WORD_TYPE_CONCATROPE);
        ASSERT(WORD_CONCATROPE_DEPTH(source) == WORD_SUBROPE_DEPTH(rope));

        leftLength = WORD_CONCATROPE_LEFT_LENGTH(source);
        if (leftLength == 0) {
            leftLength = Col_RopeLength(WORD_CONCATROPE_LEFT(source));
        }
        *leftPtr = Col_Subrope(WORD_CONCATROPE_LEFT(source),
                WORD_SUBROPE_FIRST(rope), leftLength-1);
        *rightPtr = Col_Subrope(WORD_CONCATROPE_RIGHT(source), 0,
                WORD_SUBROPE_LAST(rope)-leftLength);
    } else {
        ASSERT(WORD_CONCATROPE_DEPTH(rope) >= 1);
        ASSERT(WORD_TYPE(rope) == WORD_TYPE_CONCATROPE);

        *leftPtr  = WORD_CONCATROPE_LEFT(rope);
        *rightPtr = WORD_CONCATROPE_RIGHT(rope);
    }
}